

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

Phdr * __thiscall pstack::Elf::Object::getSegmentForAddress(Object *this,Off a)

{
  pointer paVar1;
  ProgramHeaders *pPVar2;
  Phdr *pPVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pPVar3 = this->lastSegmentForAddress;
  if (((pPVar3 == (Phdr *)0x0) || (a < pPVar3->p_vaddr)) || (pPVar3->p_vaddr + pPVar3->p_memsz <= a)
     ) {
    pPVar2 = getSegments(this,1);
    pPVar3 = (Phdr *)(pPVar2->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    paVar1 = (pPVar2->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = (long)paVar1 - (long)pPVar3;
    if (0 < (long)uVar4) {
      uVar4 = (uVar4 >> 3) * 0x6db6db6db6db6db7;
      do {
        uVar5 = uVar4 >> 1;
        uVar6 = uVar5;
        if (((pointer)pPVar3)[uVar5].p_memsz + ((pointer)pPVar3)[uVar5].p_vaddr <= a) {
          uVar6 = ~uVar5 + uVar4;
          pPVar3 = (Phdr *)((pointer)pPVar3 + uVar5 + 1);
        }
        uVar4 = uVar6;
      } while (0 < (long)uVar6);
    }
    if ((pPVar3 == (Phdr *)paVar1) || (a < ((pointer)pPVar3)->p_vaddr)) {
      pPVar3 = (Phdr *)0x0;
    }
    else {
      this->lastSegmentForAddress = pPVar3;
    }
  }
  return pPVar3;
}

Assistant:

const Phdr *
Object::getSegmentForAddress(Off a) const
{
    if (lastSegmentForAddress != nullptr &&
          lastSegmentForAddress->p_vaddr <= a &&
          lastSegmentForAddress->p_vaddr + lastSegmentForAddress->p_memsz > a)
       return lastSegmentForAddress;
    const auto &hdrs = getSegments(PT_LOAD);

    auto pos = std::lower_bound(hdrs.begin(), hdrs.end(), a,
            [] (const Elf::Phdr &header, Elf::Off addr) {
            return header.p_vaddr + header.p_memsz <= addr; });
    if (pos != hdrs.end() && pos->p_vaddr <= a) {
        lastSegmentForAddress = &*pos;
        return lastSegmentForAddress;
    }
    return nullptr;
}